

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecVec.h
# Opt level: O0

Vec_Vec_t * Vec_VecDup(Vec_Vec_t *p)

{
  int iVar1;
  Vec_Ptr_t *p_00;
  Vec_Ptr_t *pVVar2;
  undefined4 local_24;
  int i;
  Vec_Ptr_t *vVec;
  Vec_Ptr_t *vNew;
  Vec_Vec_t *p_local;
  
  iVar1 = Vec_VecSize(p);
  p_00 = Vec_PtrAlloc(iVar1);
  for (local_24 = 0; iVar1 = Vec_VecSize(p), local_24 < iVar1; local_24 = local_24 + 1) {
    pVVar2 = Vec_VecEntry(p,local_24);
    pVVar2 = Vec_PtrDup(pVVar2);
    Vec_PtrPush(p_00,pVVar2);
  }
  return (Vec_Vec_t *)p_00;
}

Assistant:

static inline Vec_Vec_t * Vec_VecDup( Vec_Vec_t * p )
{
    Vec_Ptr_t * vNew, * vVec;
    int i;
    vNew = Vec_PtrAlloc( Vec_VecSize(p) );
    Vec_VecForEachLevel( p, vVec, i )
        Vec_PtrPush( vNew, Vec_PtrDup(vVec) );
    return (Vec_Vec_t *)vNew;
}